

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O2

void QWindowContainer::parentWasRaised(QWidget *parent)

{
  bool bVar1;
  QWindowContainerPrivate *pQVar2;
  long lVar3;
  
  pQVar2 = QWindowContainerPrivate::get(parent);
  if (pQVar2 != (QWindowContainerPrivate *)0x0) {
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&pQVar2->window);
    if (!bVar1) {
      return;
    }
    lVar3 = QWindow::parent((pQVar2->window).wp.value,0);
    if (lVar3 != 0) {
      QWindow::raise();
    }
  }
  qwindowcontainer_traverse(parent,parentWasRaised);
  return;
}

Assistant:

void QWindowContainer::parentWasRaised(QWidget *parent)
{
    if (QWindowContainerPrivate *d = QWindowContainerPrivate::get(parent)) {
        if (!d->window)
            return;
        else if (d->window->parent())
            d->window->raise();
    }
    qwindowcontainer_traverse(parent, parentWasRaised);
}